

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFunctionCall(Parser *this,optional<Token> *identifierToken)

{
  bool bVar1;
  Mark *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Node *this_00;
  Tokenizer *in_RSI;
  __uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true> in_RDI;
  type func;
  Token token;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  string name;
  Mark mark;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *node;
  Token *in_stack_fffffffffffffdf8;
  Token *in_stack_fffffffffffffe00;
  unique_ptr<FunctionCallNode,_std::default_delete<FunctionCallNode>_> *in_stack_fffffffffffffe08;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__x;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_fffffffffffffe10;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  Token *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  TokenType type;
  Parser *in_stack_fffffffffffffe68;
  undefined1 local_170 [16];
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> local_160
  ;
  int local_148;
  Tokenizer *in_stack_fffffffffffffee8;
  allocator<char> local_e1;
  string local_e0 [24];
  Parser *in_stack_ffffffffffffff38;
  string local_40 [32];
  Mark local_20 [4];
  
  type = (TokenType)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  pMVar2 = Tokenizer::getMark((Tokenizer *)0x19d19c);
  local_20[0] = *pMVar2;
  std::__cxx11::string::string(local_40);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)0x19d1c1);
  if (bVar1) {
    std::optional<Token>::value((optional<Token> *)in_stack_fffffffffffffe00);
    pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,double>
                       ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)0x19d1e9);
    std::__cxx11::string::operator=(local_40,(string *)pbVar3);
  }
  else {
    in_stack_fffffffffffffe58 = Tokenizer::peek(in_RSI);
    in_stack_fffffffffffffe57 = Token::isSpecialFunction(in_stack_fffffffffffffe58);
    if ((bool)in_stack_fffffffffffffe57) {
      Tokenizer::peek(in_RSI);
      pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)0x19d272);
      std::__cxx11::string::operator=(local_40,(string *)pbVar3);
      Tokenizer::nextToken(in_stack_fffffffffffffee8);
      Token::~Token((Token *)0x19d2b1);
    }
    else {
      __s = &local_e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe40,(char *)__s,in_stack_fffffffffffffe30);
      getToken(in_stack_fffffffffffffe68,type,(string *)in_stack_fffffffffffffe58);
      pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)0x19d311);
      std::__cxx11::string::operator=(local_40,(string *)pbVar3);
      Token::~Token((Token *)0x19d337);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
    }
  }
  parseCallArgumentList_abi_cxx11_(in_stack_ffffffffffffff38);
  std::
  make_unique<FunctionCallNode,std::__cxx11::string&,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe58,
             (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
  std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::
  unique_ptr<FunctionCallNode,std::default_delete<FunctionCallNode>,void>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
             in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::unique_ptr<FunctionCallNode,_std::default_delete<FunctionCallNode>_>::~unique_ptr
            ((unique_ptr<FunctionCallNode,_std::default_delete<FunctionCallNode>_> *)
             in_stack_fffffffffffffe00);
  Tokenizer::peek(in_RSI);
  Token::Token(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  while (local_148 == 0x29) {
    parseCallArgumentList_abi_cxx11_(in_stack_ffffffffffffff38);
    __x = &local_160;
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    operator=(in_stack_fffffffffffffe10,__x);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::~list
              ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)0x19d498);
    in_stack_fffffffffffffe10 =
         (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
         )(local_170 + 8);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe00,
               (unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffdf8);
    std::
    make_unique<FunctionResultCallNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe58,
               (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    in_stack_fffffffffffffdf8 = (Token *)local_170;
    std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>::operator=
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_> *)
               __x);
    std::unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_>::
    ~unique_ptr((unique_ptr<FunctionResultCallNode,_std::default_delete<FunctionResultCallNode>_> *)
                in_stack_fffffffffffffe00);
    in_stack_fffffffffffffe00 = Tokenizer::peek(in_RSI);
    Token::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::~unique_ptr
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)
               in_stack_fffffffffffffe00);
  }
  this_00 = &std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>::operator->
                       ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)0x19d596
                       )->super_Node;
  Node::setMark(this_00,local_20);
  Token::~Token((Token *)0x19d5bd);
  std::__cxx11::
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::~list
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)0x19d5ef);
  std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (tuple<ExpressionNode_*,_std::default_delete<ExpressionNode>_>)
         in_RDI.super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
         super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
         super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFunctionCall(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  std::string name;
  if(identifierToken.has_value())
    name = std::get<std::string>(identifierToken.value().value);
  else if(Token::isSpecialFunction(tokenizer_.peek()))
  {
    name = std::get<std::string>(tokenizer_.peek().value);
    tokenizer_.nextToken();
  }
  else
    name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  
  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<FunctionCallNode>(name, std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }

  node->setMark(mark);
  return node;
}